

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

size_t UnwrittenBytes(BrotliDecoderStateInternal *s,int wrap)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = s->pos;
  iVar2 = s->ringbuffer_size;
  iVar3 = iVar2;
  if (iVar1 < iVar2) {
    iVar3 = iVar1;
  }
  if (wrap == 0) {
    iVar3 = iVar1;
  }
  return ((long)iVar3 - s->partial_pos_out) + (long)iVar2 * s->rb_roundtrips;
}

Assistant:

static size_t UnwrittenBytes(const BrotliDecoderState* s, BROTLI_BOOL wrap) {
  size_t pos = wrap && s->pos > s->ringbuffer_size ?
      (size_t)s->ringbuffer_size : (size_t)(s->pos);
  size_t partial_pos_rb = (s->rb_roundtrips * (size_t)s->ringbuffer_size) + pos;
  return partial_pos_rb - s->partial_pos_out;
}